

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SamplerTest.cpp
# Opt level: O2

void __thiscall
jaegertracing::samplers::Sampler_testProbabilisticSamplerPerformance_Test::TestBody
          (Sampler_testProbabilisticSamplerPerformance_Test *this)

{
  ulong uVar1;
  ostream *poVar2;
  int iVar3;
  long lVar4;
  long lVar5;
  bool bVar6;
  undefined1 auVar7 [16];
  allocator local_1451;
  default_random_engine randomGenerator;
  TraceID id;
  uniform_int_distribution<unsigned_long> distribution;
  SamplingStatus local_1428;
  ProbabilisticSampler sampler;
  string local_13d8;
  random_device randomDevice;
  
  ProbabilisticSampler::ProbabilisticSampler(&sampler,0.001);
  std::random_device::random_device(&randomDevice);
  uVar1 = std::random_device::_M_getval();
  lVar4 = 0;
  iVar3 = (int)((uVar1 & 0xffffffff) % 0x7fffffff);
  randomGenerator._M_x = (unsigned_long)(iVar3 + (uint)(iVar3 == 0));
  distribution._M_param._M_a = 0;
  distribution._M_param._M_b = 0xffffffffffffffff;
  lVar5 = 10000;
  while (bVar6 = lVar5 != 0, lVar5 = lVar5 + -1, bVar6) {
    id._low = std::uniform_int_distribution<unsigned_long>::operator()
                        (&distribution,&randomGenerator);
    id._high = 0;
    std::__cxx11::string::string((string *)&local_13d8,"op",&local_1451);
    ProbabilisticSampler::isSampled(&local_1428,&sampler,&id,&local_13d8);
    uVar1 = (ulong)local_1428._isSampled;
    std::vector<jaegertracing::Tag,_std::allocator<jaegertracing::Tag>_>::~vector(&local_1428._tags)
    ;
    std::__cxx11::string::~string((string *)&local_13d8);
    lVar4 = lVar4 + uVar1;
  }
  poVar2 = std::operator<<((ostream *)&std::cout,"Sampled: ");
  poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
  std::operator<<(poVar2," rate=");
  auVar7._8_4_ = (int)((ulong)lVar4 >> 0x20);
  auVar7._0_8_ = lVar4;
  auVar7._12_4_ = 0x45300000;
  poVar2 = std::ostream::_M_insert<double>
                     (((auVar7._8_8_ - 1.9342813113834067e+25) +
                      ((double)CONCAT44(0x43300000,(int)lVar4) - 4503599627370496.0)) / 10000.0);
  std::operator<<(poVar2,'\n');
  std::random_device::~random_device(&randomDevice);
  ProbabilisticSampler::~ProbabilisticSampler(&sampler);
  return;
}

Assistant:

TEST(Sampler, testProbabilisticSamplerPerformance)
{
    constexpr auto kNumSamples = static_cast<uint64_t>(10000);

    ProbabilisticSampler sampler(0.001);
    std::random_device randomDevice;
    std::default_random_engine randomGenerator(randomDevice());
    std::uniform_int_distribution<uint64_t> distribution;
    auto count = static_cast<uint64_t>(0);
    for (auto i = static_cast<uint64_t>(0); i < kNumSamples; ++i) {
        TraceID id(0, distribution(randomGenerator));
        if (sampler.isSampled(id, kTestOperationName).isSampled()) {
            ++count;
        }
    }
    const auto rate = static_cast<double>(count) / kNumSamples;
    std::cout << "Sampled: " << count << " rate=" << rate << '\n';
}